

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomenoise.c
# Opt level: O2

Range * getVoronoiSrcRange(Range r)

{
  Range *in_RDI;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  if (r.scale == 1) {
    in_RDI->scale = 4;
    iVar1 = r.x + -2;
    iVar3 = r.z + -2;
    iVar2 = iVar1 >> 2;
    iVar4 = iVar3 >> 2;
    in_RDI->x = iVar2;
    in_RDI->z = iVar4;
    in_RDI->sx = ((r.sx + iVar1 >> 2) - iVar2) + 2;
    in_RDI->sz = ((r.sz + iVar3 >> 2) - iVar4) + 2;
    if (r.sy < 1) {
      iVar2 = 0;
      iVar1 = 0;
    }
    else {
      iVar1 = r.y + -2 >> 2;
      iVar2 = ((r.sy + r.y + -2 >> 2) - iVar1) + 2;
    }
    in_RDI->sy = iVar2;
    in_RDI->y = iVar1;
    return in_RDI;
  }
  puts("getVoronoiSrcRange() expects input range with scale 1:1");
  exit(1);
}

Assistant:

Range getVoronoiSrcRange(Range r)
{
    if (r.scale != 1)
    {
        printf("getVoronoiSrcRange() expects input range with scale 1:1\n");
        exit(1);
    }

    Range s; // output has scale 1:4
    int x = r.x - 2;
    int z = r.z - 2;
    s.scale = 4;
    s.x = x >> 2;
    s.z = z >> 2;
    s.sx = ((x + r.sx) >> 2) - s.x + 2;
    s.sz = ((z + r.sz) >> 2) - s.z + 2;
    if (r.sy < 1)
    {
        s.y = s.sy = 0;
    }
    else
    {
        int ty = r.y - 2;
        s.y = ty >> 2;
        s.sy = ((ty + r.sy) >> 2) - s.y + 2;
    }
    return s;
}